

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::
PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int,int,int>>>
::operator()(PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,_int,_int,_int,_int,_int>_>_>
             *this,char *value_text,vector<unsigned_int,_std::allocator<unsigned_int>_> *x)

{
  bool bVar1;
  AssertionResult *this_00;
  sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *value;
  StringMatchResultListener *pSVar2;
  char *in_RDX;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult *in_RDI;
  AssertionResult AVar3;
  StringMatchResultListener listener;
  stringstream ss;
  Matcher<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&> matcher;
  StringMatchResultListener *in_stack_fffffffffffffbe8;
  ostream *poVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffc18;
  MatcherBase<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
  *in_stack_fffffffffffffc20;
  AssertionResult *this_01;
  string local_3b8 [48];
  string local_388 [400];
  MatchResultListener *in_stack_fffffffffffffe08;
  Matcher<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
  *in_stack_fffffffffffffe10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe18;
  stringstream local_1d0 [16];
  ostream local_1c0 [376];
  undefined4 local_48;
  char *local_18;
  
  this_01 = in_RDI;
  local_18 = in_RDX;
  SafeMatcherCast<std::vector<unsigned_int,std::allocator<unsigned_int>>const&,testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int,int,int>>>
            ((ElementsAreMatcher<std::tuple<int,_int,_int,_int,_int,_int>_> *)
             in_stack_fffffffffffffbe8);
  bVar1 = MatcherBase<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>::Matches
                    (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  if (bVar1) {
    AssertionSuccess();
    local_48 = 1;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1d0);
    this_00 = (AssertionResult *)std::operator<<(local_1c0,"Value of: ");
    value = (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
            std::operator<<((ostream *)this_00,local_18);
    pSVar2 = (StringMatchResultListener *)std::operator<<((ostream *)value,"\n");
    std::operator<<((ostream *)pSVar2,"Expected: ");
    poVar4 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x1d0) {
      poVar4 = local_1c0;
    }
    MatcherBase<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>::DescribeTo
              ((MatcherBase<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&> *)
               pSVar2,poVar4);
    StringMatchResultListener::StringMatchResultListener(pSVar2);
    bVar1 = MatchPrintAndExplain<std::vector<unsigned_int,std::allocator<unsigned_int>>const,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
                      (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08
                      );
    if (bVar1) {
      std::operator<<(local_1c0,
                      "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                     );
    }
    poVar4 = std::operator<<(local_1c0,"\n  Actual: ");
    StringMatchResultListener::str_abi_cxx11_(in_stack_fffffffffffffbe8);
    std::operator<<(poVar4,local_388);
    std::__cxx11::string::~string(local_388);
    AssertionFailure();
    std::__cxx11::stringstream::str();
    pSVar2 = (StringMatchResultListener *)AssertionResult::operator<<(this_00,value);
    AssertionResult::AssertionResult(this_01,in_RDI);
    std::__cxx11::string::~string(local_3b8);
    AssertionResult::~AssertionResult((AssertionResult *)0x9a824a);
    local_48 = 1;
    StringMatchResultListener::~StringMatchResultListener(pSVar2);
    std::__cxx11::stringstream::~stringstream(local_1d0);
  }
  Matcher<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>::~Matcher
            ((Matcher<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&> *)0x9a8301);
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar3._0_8_ = this_01;
  return AVar3;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);

    // The expected path here is that the matcher should match (i.e. that most
    // tests pass) so optimize for this case.
    if (matcher.Matches(x)) {
      return AssertionSuccess();
    }

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);

    // Rerun the matcher to "PrintAndExplain" the failure.
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener)) {
      ss << "\n  The matcher failed on the initial attempt; but passed when "
            "rerun to generate the explanation.";
    }
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }